

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::
statement_inner<char_const*,char_const(&)[10],char_const*&,char_const(&)[2],char_const*,char_const*&>
          (CompilerGLSL *this,char **t,char (*ts) [10],char **ts_1,char (*ts_2) [2],char **ts_3,
          char **ts_4)

{
  StringStream<4096UL,_4096UL>::operator<<(&this->buffer,*t);
  this->statement_count = this->statement_count + 1;
  statement_inner<char_const(&)[10],char_const*&,char_const(&)[2],char_const*,char_const*&>
            (this,ts,ts_1,ts_2,ts_3,ts_4);
  return;
}

Assistant:

inline void statement_inner(T &&t, Ts &&... ts)
	{
		buffer << std::forward<T>(t);
		statement_count++;
		statement_inner(std::forward<Ts>(ts)...);
	}